

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

SoftmaxNDLayerParams * __thiscall
CoreML::Specification::SoftmaxNDLayerParams::New(SoftmaxNDLayerParams *this,Arena *arena)

{
  SoftmaxNDLayerParams *this_00;
  
  this_00 = (SoftmaxNDLayerParams *)operator_new(0x20);
  SoftmaxNDLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::SoftmaxNDLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

SoftmaxNDLayerParams* SoftmaxNDLayerParams::New(::google::protobuf::Arena* arena) const {
  SoftmaxNDLayerParams* n = new SoftmaxNDLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}